

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall
ON_ArchivableDictionary::Read(ON_ArchivableDictionary *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  uint uVar2;
  DictionaryEntry *__p;
  pointer pDVar3;
  mapped_type *this_00;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> local_78;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> value;
  int rc;
  ON_wString item_name;
  int local_58;
  int item_type;
  ON_wString local_48;
  ON_wString dictionary_name;
  undefined1 auStack_38 [4];
  uint dictionary_version;
  ON_UUID dictionary_id;
  ON_BinaryArchive *binary_archive_local;
  ON_ArchivableDictionary *this_local;
  
  auStack_38 = (undefined1  [4])0x0;
  dictionary_version._0_2_ = 0;
  dictionary_version._2_2_ = 0;
  dictionary_id.Data1 = 0;
  dictionary_id.Data2 = 0;
  dictionary_id.Data3 = 0;
  dictionary_name.m_s._4_4_ = 0;
  ON_wString::ON_wString(&local_48);
  std::
  map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  ::clear(&this->m_private->m_map);
  bVar1 = ON_BinaryArchive::BeginReadDictionary
                    (binary_archive,(ON_UUID *)auStack_38,(uint *)((long)&dictionary_name.m_s + 4),
                     &local_48);
  if (bVar1) {
    bVar1 = ::operator!=((ON_UUID_struct *)auStack_38,&RhinoDotNetDictionaryId);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      do {
        ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff98);
        value._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>.
        _M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
        super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl._4_4_ =
             ON_BinaryArchive::BeginReadDictionaryEntry
                       (binary_archive,(int *)((long)&item_name.m_s + 4),
                        (ON_wString *)&stack0xffffffffffffff98);
        if (value._M_t.super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>
            ._M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
            super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl._4_4_ == 1) {
          __p = DictionaryEntry::CreateInstance(item_name.m_s._4_4_);
          std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>::
          unique_ptr<std::default_delete<DictionaryEntry>,void>
                    ((unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *)&local_78,
                     __p);
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_78);
          if (bVar1) {
            pDVar3 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::
                     operator->(&local_78);
            uVar2 = (*pDVar3->_vptr_DictionaryEntry[5])(pDVar3,binary_archive);
            if ((uVar2 & 1) != 0) {
              this_00 = std::
                        map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
                        ::operator[](&this->m_private->m_map,(key_type *)&stack0xffffffffffffff98);
              std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator=
                        (this_00,&local_78);
              goto LAB_0047729f;
            }
            this_local._7_1_ = 0;
            local_58 = 1;
          }
          else {
            ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archivable_dictionary.cpp"
                         ,0x164,"","Uknown ArchivableDictionary item type %d.",
                         (ulong)item_name.m_s._4_4_);
LAB_0047729f:
            local_58 = 0;
          }
          std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::~unique_ptr
                    (&local_78);
          if (local_58 == 0) {
            bVar1 = ON_BinaryArchive::EndReadDictionaryEntry(binary_archive);
            if (bVar1) {
              local_58 = 0;
            }
            else {
              this_local._7_1_ = 0;
              local_58 = 1;
            }
          }
        }
        else if (value._M_t.
                 super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
                 super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
                 super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl._4_4_ == 2) {
          local_58 = 3;
        }
        else {
          this_local._7_1_ = 0;
          local_58 = 1;
        }
        ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff98);
      } while (local_58 == 0);
      if (local_58 == 3) {
        this_local._7_1_ = ON_BinaryArchive::EndReadDictionary(binary_archive);
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  ON_wString::~ON_wString(&local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_ArchivableDictionary::Read(ON_BinaryArchive& binary_archive)
{
  ON_UUID dictionary_id = {};
  unsigned int dictionary_version = {};
  ON_wString dictionary_name;
  m_private->m_map.clear();

  if (!binary_archive.BeginReadDictionary(&dictionary_id, &dictionary_version, dictionary_name))
    return false;

  if (dictionary_id != RhinoDotNetDictionaryId)
    return false;

  while (true)
  {
    int        item_type;
    ON_wString item_name;
    auto rc = binary_archive.BeginReadDictionaryEntry(&item_type, item_name);
    if (rc == 1)
    {
      std::unique_ptr<DictionaryEntry> value(DictionaryEntry::CreateInstance((DictionaryEntryType)item_type));
      if (value)
      {
        if (!value->ReadDictionaryEntry(binary_archive))
          return false;

        m_private->m_map[item_name] = std::move(value);
      }
      else
      {
        // We skip unknown item types
        ON_WarningEx(__FILE__, __LINE__, OPENNURBS__FUNCTION__, "Uknown ArchivableDictionary item type %d.", item_type);
      }
    }
    else if (rc == 2) break;
    else              return false;

    if (!binary_archive.EndReadDictionaryEntry())
      return false;
  }

  return binary_archive.EndReadDictionary();
}